

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

void add_format(FMFormat_conflict f,FMFormat_conflict *sorted,FMFormat_conflict *visited,
               FMFormat_conflict *stack)

{
  int iVar1;
  FMFormat_conflict p_Var2;
  undefined1 *__base;
  FMFormat_conflict *pp_Var3;
  FMFormat_conflict *pp_Var4;
  code *stack_00;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  FMFormat_conflict tmp [100];
  undefined1 auStack_358 [808];
  
  __base = auStack_358;
  p_Var2 = *visited;
  if (p_Var2 != (FMFormat_conflict)0x0) {
    pp_Var4 = visited + 1;
    do {
      if (p_Var2 == f) {
        return;
      }
      p_Var2 = *pp_Var4;
      pp_Var4 = pp_Var4 + 1;
    } while (p_Var2 != (FMFormat_conflict)0x0);
  }
  pp_Var4 = visited;
  if (99 < (ulong)(long)f->field_count) {
    __base = (undefined1 *)ffs_malloc((long)f->field_count << 3);
  }
  do {
    pp_Var3 = pp_Var4;
    pp_Var4 = pp_Var3 + 1;
  } while (*pp_Var3 != (FMFormat_conflict)0x0);
  *pp_Var3 = f;
  pp_Var3[1] = (FMFormat_conflict)0x0;
  iVar1 = f->field_count;
  if ((long)iVar1 < 1) {
    uVar6 = 0;
  }
  else {
    pp_Var4 = f->field_subformats;
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (pp_Var4[lVar5] != (FMFormat_conflict)0x0) {
        lVar8 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        *(FMFormat_conflict *)(__base + lVar8 * 8) = pp_Var4[lVar5];
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  stack_00 = compare_by_name_FMFormat;
  qsort(__base,(long)(int)uVar6,8,compare_by_name_FMFormat);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      add_format(*(FMFormat_conflict *)(__base + uVar7 * 8),sorted,visited,
                 (FMFormat_conflict *)stack_00);
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  do {
    pp_Var4 = sorted;
    sorted = pp_Var4 + 1;
  } while (*pp_Var4 != (FMFormat_conflict)0x0);
  *pp_Var4 = f;
  pp_Var4[1] = (FMFormat_conflict)0x0;
  if (__base != auStack_358) {
    free(__base);
  }
  return;
}

Assistant:

static
void add_format(FMFormat f, FMFormat* sorted, FMFormat *visited, FMFormat* stack)
{
    /* if n has not been visited yet then */
    if (!on_list(f, visited)) {
	FMFormat tmp[100];
	FMFormat *tmp_list = &tmp[0];
	if (f->field_count >= (sizeof(tmp)/sizeof(tmp[0]))) {
	    tmp_list = malloc(f->field_count * sizeof(tmp[0]));
	}
	int count = 0;
	int i;
        /* mark n as visited */
	add_to_list(f, visited);

	/* get subfields and sort them by name for predictability */
	for (i=0; i < f->field_count; i++) {
	    if (f->field_subformats[i] != NULL) {
		tmp_list[count++] = f->field_subformats[i];
	    }
	}
	qsort(&tmp_list[0], count, sizeof(tmp_list[0]), compare_by_name_FMFormat);

	for (i=0; i < count; i++) {
	    add_format(tmp_list[i], sorted, visited, stack);
	}
	add_to_list(f, sorted);
	if (tmp_list != &tmp[0]) free(tmp_list);
    }
}